

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int readsTable(Parse *p,int iDb,Table *pTab)

{
  int iVar1;
  Vdbe *p_00;
  VdbeOp *pVVar2;
  VTable *local_60;
  Index *pIStack_50;
  int tnum;
  Index *pIndex;
  VdbeOp *pOp;
  VTable *pVTab;
  int iEnd;
  int i;
  Vdbe *v;
  Table *pTab_local;
  int iDb_local;
  Parse *p_local;
  
  p_00 = sqlite3GetVdbe(p);
  iVar1 = sqlite3VdbeCurrentAddr(p_00);
  if (pTab->nModuleArg == 0) {
    local_60 = (VTable *)0x0;
  }
  else {
    local_60 = sqlite3GetVTable(p->db,pTab);
  }
  pVTab._4_4_ = 1;
  while( true ) {
    if (iVar1 <= pVTab._4_4_) {
      return 0;
    }
    pVVar2 = sqlite3VdbeGetOp(p_00,pVTab._4_4_);
    if ((pVVar2->opcode == 'l') && (pVVar2->p3 == iDb)) {
      if (pVVar2->p2 == pTab->tnum) {
        return 1;
      }
      for (pIStack_50 = pTab->pIndex; pIStack_50 != (Index *)0x0; pIStack_50 = pIStack_50->pNext) {
        if (pVVar2->p2 == pIStack_50->tnum) {
          return 1;
        }
      }
    }
    if ((pVVar2->opcode == 0xa3) && ((VTable *)(pVVar2->p4).p == local_60)) break;
    pVTab._4_4_ = pVTab._4_4_ + 1;
  }
  return 1;
}

Assistant:

static int readsTable(Parse *p, int iDb, Table *pTab){
  Vdbe *v = sqlite3GetVdbe(p);
  int i;
  int iEnd = sqlite3VdbeCurrentAddr(v);
#ifndef SQLITE_OMIT_VIRTUALTABLE
  VTable *pVTab = IsVirtual(pTab) ? sqlite3GetVTable(p->db, pTab) : 0;
#endif

  for(i=1; i<iEnd; i++){
    VdbeOp *pOp = sqlite3VdbeGetOp(v, i);
    assert( pOp!=0 );
    if( pOp->opcode==OP_OpenRead && pOp->p3==iDb ){
      Index *pIndex;
      int tnum = pOp->p2;
      if( tnum==pTab->tnum ){
        return 1;
      }
      for(pIndex=pTab->pIndex; pIndex; pIndex=pIndex->pNext){
        if( tnum==pIndex->tnum ){
          return 1;
        }
      }
    }
#ifndef SQLITE_OMIT_VIRTUALTABLE
    if( pOp->opcode==OP_VOpen && pOp->p4.pVtab==pVTab ){
      assert( pOp->p4.pVtab!=0 );
      assert( pOp->p4type==P4_VTAB );
      return 1;
    }
#endif
  }
  return 0;
}